

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O1

bool __thiscall cs::domain_manager::exist_record(domain_manager *this,string *name)

{
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pfVar1;
  size_t sVar2;
  error *this_00;
  string local_30;
  
  pfVar1 = (this->m_set).m_current;
  if (pfVar1 != (this->m_set).m_start) {
    sVar2 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::count<std::__cxx11::string>
                      ((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)(pfVar1 + -1),name);
    return sVar2 != 0;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30.field_2._M_allocated_capacity._0_4_ = 0x30303045;
  local_30.field_2._M_allocated_capacity._4_2_ = 0x48;
  local_30._M_string_length = 5;
  cov::error::error(this_00,&local_30);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

bool exist_record(const string &name)
		{
			return m_set.top().count(name) > 0;
		}